

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_overlay.cpp
# Opt level: O1

array<unsigned_long,_8UL> * __thiscall
Omega_h::Overlay::get_cell_nodes
          (array<unsigned_long,_8UL> *__return_storage_ptr__,Overlay *this,size_t cell)

{
  int *piVar1;
  void *pvVar2;
  size_t i;
  long lVar3;
  Alloc *this_00;
  long lVar4;
  Adj AStack_58;
  
  Omega_h::Mesh::get_adj(&AStack_58,&this->mesh,3,0);
  pvVar2 = AStack_58.super_Graph.ab2b.write_.shared_alloc_.direct_ptr;
  this_00 = AStack_58.super_Graph.ab2b.write_.shared_alloc_.alloc;
  if ((((ulong)AStack_58.super_Graph.ab2b.write_.shared_alloc_.alloc & 7) == 0 &&
       AStack_58.super_Graph.ab2b.write_.shared_alloc_.alloc != (Alloc *)0x0) &&
     (entering_parallel == '\x01')) {
    (AStack_58.super_Graph.ab2b.write_.shared_alloc_.alloc)->use_count =
         (AStack_58.super_Graph.ab2b.write_.shared_alloc_.alloc)->use_count + -1;
    this_00 = (Alloc *)((AStack_58.super_Graph.ab2b.write_.shared_alloc_.alloc)->size * 8 + 1);
  }
  AStack_58.super_Graph.ab2b.write_.shared_alloc_.alloc = (Alloc *)0x0;
  AStack_58.super_Graph.ab2b.write_.shared_alloc_.direct_ptr = (void *)0x0;
  Adj::~Adj(&AStack_58);
  lVar4 = cell << 0x23;
  lVar3 = 0;
  do {
    __return_storage_ptr__->_M_elems[lVar3] = (long)*(int *)((long)pvVar2 + (lVar4 >> 0x1e));
    lVar3 = lVar3 + 1;
    lVar4 = lVar4 + 0x100000000;
  } while (lVar3 != 8);
  if (((ulong)this_00 & 7) == 0 && this_00 != (Alloc *)0x0) {
    piVar1 = &this_00->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(this_00);
      operator_delete(this_00,0x48);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::array<size_t, 8> Overlay::get_cell_nodes(size_t cell) const {
  std::array<size_t, 8> nodes;
  auto cells2nodes = mesh.get_adj(REGION, VERT).ab2b;
  for (size_t i = 0; i < 8; ++i) {
    nodes[i] = size_t(cells2nodes[LO(cell * 8 + i)]);
  }
  return nodes;
}